

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O2

int lws_http_cookie_get(lws *wsi,char *name,char *buf,size_t *max_len)

{
  size_t sVar1;
  allocated_headers *paVar2;
  uint uVar3;
  int iVar4;
  size_t __n;
  uint8_t *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  
  sVar1 = *max_len;
  __n = strlen(name);
  uVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COOKIE);
  uVar7 = __n + 1;
  iVar4 = 1;
  if (uVar7 <= uVar3) {
    iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_METHOD);
    paVar2 = (wsi->http).ah;
    if (iVar4 == 0) {
      if (paVar2 == (allocated_headers *)0x0) {
        iVar4 = 1;
      }
      else {
        iVar4 = 1;
        if (((ulong)paVar2->frag_index[0x1a] != 0) && (paVar2->data != (char *)0x0)) {
          pcVar12 = paVar2->data + paVar2->frags[paVar2->frag_index[0x1a]].offset;
          for (iVar11 = uVar3 - (int)__n; iVar4 = 1, (int)__n < iVar11; iVar11 = iVar11 + -1) {
            if ((pcVar12[__n] == '=') && (iVar4 = bcmp(pcVar12,name,__n & 0xffffffff), iVar4 == 0))
            {
              iVar4 = 1;
              for (sVar6 = 0;
                  ((pcVar12[__n + sVar6 + 1] != ';' && (iVar11 != iVar4)) && (sVar1 != sVar6));
                  sVar6 = sVar6 + 1) {
                buf[sVar6] = pcVar12[__n + sVar6 + 1];
                iVar4 = iVar4 + 1;
              }
              if (sVar1 != sVar6) {
                buf[sVar6] = '\0';
                *max_len = sVar6;
                return 0;
              }
              return 2;
            }
            pcVar12 = pcVar12 + 1;
          }
        }
      }
    }
    else {
      puVar5 = paVar2->frag_index + 0x1a;
      while (uVar10 = (ulong)*puVar5, uVar10 != 0) {
        uVar8 = (ulong)paVar2->frags[uVar10].len;
        uVar9 = uVar8 - uVar7;
        if (((uVar7 <= uVar8) &&
            (pcVar12 = paVar2->data + paVar2->frags[uVar10].offset, pcVar12[__n] == '=')) &&
           (iVar4 = bcmp(pcVar12,name,__n), iVar4 == 0)) {
          uVar7 = sVar1 - 1;
          if (uVar9 <= sVar1 - 1) {
            uVar7 = uVar9;
          }
          if (uVar7 != 0) {
            memcpy(buf,pcVar12 + __n + 1,uVar7);
          }
          *max_len = uVar7;
          buf[uVar7] = '\0';
          return 0;
        }
        puVar5 = &paVar2->frags[uVar10].nfrag;
      }
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int
lws_http_cookie_get(struct lws *wsi, const char *name, char *buf,
		    size_t *max_len)
{
	size_t max = *max_len, bl = strlen(name);
	char *p, *bo = buf;
	int n;

	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COOKIE);
	if ((unsigned int)n < bl + 1)
		return 1;

	/*
	 * This can come to us two ways, in ah fragments (h2) or as a single
	 * semicolon-delimited string (h1)
	 */

#if defined(LWS_ROLE_H2)
	if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_METHOD)) {

		/*
		 * The h2 way...
		 */

		int f = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_COOKIE];
		size_t fl;

		while (f) {
			p = wsi->http.ah->data + wsi->http.ah->frags[f].offset;
			fl = (size_t)wsi->http.ah->frags[f].len;
			if (fl >= bl + 1 &&
			    p[bl] == '=' &&
			    !memcmp(p, name, bl)) {
				fl -= bl + 1;
				if (max - 1 < fl)
					fl = max - 1;
				if (fl)
					memcpy(buf, p + bl + 1, fl);
				*max_len = fl;
				buf[fl] = '\0';

				return 0;
			}
			f = wsi->http.ah->frags[f].nfrag;
		}

		return -1;
	}
#endif

	/*
	 * The h1 way...
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COOKIE);
	if (!p)
		return 1;

	p += bl;
	n -= (int)bl;
	while (n-- > (int)bl) {
		if (*p == '=' && !memcmp(p - bl, name, (unsigned int)bl)) {
			p++;
			while (*p != ';' && n-- && max) {
				*buf++ = *p++;
				max--;
			}
			if (!max)
				return 2;

			*buf = '\0';
			*max_len = lws_ptr_diff_size_t(buf, bo);

			return 0;
		}
		p++;
	}

	return 1;
}